

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,CBString *b)

{
  int iVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  int len;
  allocator local_79;
  CBStringException bstr__cppwrapper_exception;
  string local_50;
  string local_30;
  
  iVar1 = (this->super_tagbstring).mlen;
  if (iVar1 < 1) {
    std::__cxx11::string::string((string *)&local_30,"CBString::Write protection error",&local_79);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  len = (b->super_tagbstring).slen;
  if (iVar1 <= len) {
    alloc(this,len);
    len = (b->super_tagbstring).slen;
  }
  (this->super_tagbstring).slen = len;
  __dest = (this->super_tagbstring).data;
  if (__dest != (uchar *)0x0) {
    memcpy(__dest,(b->super_tagbstring).data,(long)len);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    return this;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  std::__cxx11::string::string
            ((string *)&local_50,"CBString::Failure in =(CBString) operator",&local_79);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const CBString& b) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (b.slen >= mlen) alloc (b.slen);

	slen = b.slen;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(CBString) operator");
	} else {
		bstr__memcpy (data, b.data, slen);
		data[slen] = '\0';
	}
	return *this;
}